

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_allEqual_vec2(ShaderEvalContext *c)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  float *pfVar4;
  float *pfVar5;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_4 = c->in[0].m_data[3];
  local_8 = c->in[0].m_data[1];
  local_c = c->in[1].m_data[1];
  local_10 = c->in[1].m_data[0];
  bVar1 = true;
  pfVar4 = &local_4;
  pfVar5 = &local_c;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    if (bVar1) {
      bVar1 = *pfVar5 == *pfVar4;
    }
    else {
      bVar1 = false;
    }
    pfVar4 = &local_8;
    pfVar5 = &local_10;
    bVar2 = false;
  } while (bVar3);
  (c->color).m_data[0] = (float)bVar1;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }